

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

bool __thiscall crnlib::dxt_image::has_alpha(dxt_image *this)

{
  dxt_format dVar1;
  element *peVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  uint y;
  long lVar6;
  
  dVar1 = this->m_format;
  if ((uint)dVar1 < 0xc) {
    if ((0xa1eU >> (dVar1 & 0x1f) & 1) != 0) {
      return true;
    }
    if (dVar1 == cDXT1) {
      peVar2 = this->m_pElements;
      for (uVar5 = 0; uVar5 != this->m_total_elements; uVar5 = uVar5 + 1) {
        if (*(ushort *)peVar2[uVar5].m_bytes <= *(ushort *)(peVar2[uVar5].m_bytes + 2)) {
          for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
            iVar4 = 0;
            while (iVar4 + 2 != 10) {
              bVar3 = (byte)iVar4;
              iVar4 = iVar4 + 2;
              if ((~(peVar2[uVar5].m_bytes[lVar6 + 4] >> (bVar3 & 0x1f)) & 3) == 0) {
                return true;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool dxt_image::has_alpha() const {
  switch (m_format) {
    case cDXT1: {
      for (uint i = 0; i < m_total_elements; i++) {
        const dxt1_block& blk = *(dxt1_block*)&m_pElements[i];

        if (blk.get_low_color() <= blk.get_high_color()) {
          for (uint y = 0; y < cDXTBlockSize; y++)
            for (uint x = 0; x < cDXTBlockSize; x++)
              if (blk.get_selector(x, y) == 3)
                return true;
        }
      }

      break;
    }
    case cDXT1A:
    case cDXT3:
    case cDXT5:
    case cDXT5A:
    case cETC2A:
    case cETC2AS:
      return true;
    default:
      break;
  }

  return false;
}